

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::StaticAssertion::StaticAssertion
          (StaticAssertion *this,Context *c,Expression *failureCondition,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SourceCodeText *pSVar3;
  pointer pcVar4;
  Scope *pSVar5;
  undefined8 uVar6;
  
  (this->super_Expression).super_Statement.super_ASTObject.objectType = StaticAssertion;
  pSVar3 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pSVar5 = c->parentScope;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = pSVar5;
  (this->super_Expression).kind = unknown;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__StaticAssertion_002cc870;
  (this->condition).object = failureCondition;
  paVar1 = &(this->errorMessage).field_2;
  (this->errorMessage)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (error->_M_dataplus)._M_p;
  paVar2 = &error->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&error->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->errorMessage).field_2 + 8) = uVar6;
  }
  else {
    (this->errorMessage)._M_dataplus._M_p = pcVar4;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->errorMessage)._M_string_length = error->_M_string_length;
  (error->_M_dataplus)._M_p = (pointer)paVar2;
  error->_M_string_length = 0;
  (error->field_2)._M_local_buf[0] = '\0';
  if ((this->errorMessage)._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&this->errorMessage,0,(char *)0x0,0x27bd68);
  }
  if ((((this->condition).object)->kind & ~unknown) == value) {
    return;
  }
  throwInternalCompilerError("isPossiblyValue (condition.get())","StaticAssertion",0xa38);
}

Assistant:

StaticAssertion (const Context& c, Expression& failureCondition, std::string error)
            : Expression (ObjectType::StaticAssertion, c, ExpressionKind::unknown),
              condition (failureCondition), errorMessage (std::move (error))
        {
            if (errorMessage.empty())
                errorMessage = "static_assert failed";

            SOUL_ASSERT (isPossiblyValue (condition.get()));
        }